

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O1

int __thiscall despot::BaseRockSample::NextState(BaseRockSample *this,int s,ACT_TYPE a)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  int local_38;
  int iStack_34;
  Coord local_30 [8];
  
  iVar2 = (**(code **)(*(long *)this + 0x10))();
  if (iVar2 + -1 != s) {
    iVar3 = s >> ((byte)this->num_rocks_ & 0x1f);
    iVar2 = (this->grid_).xsize_;
    despot::Coord::Coord((Coord *)&local_38,iVar3 % iVar2,iVar3 / iVar2);
    if (3 < a) {
      if (a != 4) {
        return s;
      }
      iVar3 = s >> ((byte)this->num_rocks_ & 0x1f);
      iVar2 = (this->grid_).xsize_;
      despot::Coord::Coord(local_30,iVar3 % iVar2,iVar3 / iVar2);
      piVar4 = Grid<int>::operator()(&this->grid_,local_30);
      bVar1 = (byte)*piVar4 & 0x1f;
      uVar5 = 0xffffffff;
      if (-1 < *piVar4) {
        uVar5 = -2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1;
      }
      return s & uVar5;
    }
    despot::operator+=((Coord *)&local_38,(Coord *)(&Compass::DIRECTIONS + a));
    if ((((-1 < local_38) && (-1 < iStack_34)) && (local_38 < (this->grid_).xsize_)) &&
       (iStack_34 < (this->grid_).ysize_)) {
      bVar1 = (byte)this->num_rocks_;
      return ((iStack_34 * (this->grid_).xsize_ + local_38) - (s >> (bVar1 & 0x1f)) <<
             (bVar1 & 0x1f)) + s;
    }
    if (local_38 != (this->grid_).xsize_) {
      return s;
    }
  }
  iVar2 = (**(code **)(*(long *)this + 0x10))(this);
  return iVar2 + -1;
}

Assistant:

int BaseRockSample::NextState(int s, ACT_TYPE a) const {
	if (s == NumStates() - 1)
		return NumStates() - 1;

	Coord rob_pos = IndexToCoord(s >> num_rocks_);
	if (a < E_SAMPLE) {
		rob_pos += Compass::DIRECTIONS[a];
		if (grid_.Inside(rob_pos)) {
			int next_pos = CoordToIndex(rob_pos);
			return s + ((next_pos - (s >> num_rocks_)) << num_rocks_);
		} else {
			return rob_pos.x == grid_.xsize() ? (NumStates() - 1) : s;
		}
	} else if (a == E_SAMPLE) {
		int next = s;
		Coord rob_pos = IndexToCoord(s >> num_rocks_);
		int rock = grid_(rob_pos);
		if (rock >= 0)
			UnsetFlag(next, rock);
		return next;
	} else
		return s;
}